

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chip8.cpp
# Opt level: O2

void __thiscall Chip8::OP_8XY0(Chip8 *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"LD V");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,", V");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"                 ; Set Vx = Vy");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void Chip8::OP_8XY0() {
    std::cout << "LD V"<<((opcode & 0x0F00u) >> 8u) << ", V"<<((opcode & 0x00F0u) >> 4u)<< "                 ; Set Vx = Vy" << std::endl;
}